

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void spr_write_dbatu(DisasContext_conflict10 *ctx,int sprn,int gprn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 arg2;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  arg2 = tcg_const_i32_ppc64(tcg_ctx,(sprn + -0x218) / 2);
  gen_helper_store_dbatu(tcg_ctx,tcg_ctx->cpu_env,arg2,cpu_gpr[gprn]);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(arg2 + (long)tcg_ctx));
  return;
}

Assistant:

static void spr_write_dbatu(DisasContext *ctx, int sprn, int gprn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_const_i32(tcg_ctx, (sprn - SPR_DBAT0U) / 2);
    gen_helper_store_dbatu(tcg_ctx, tcg_ctx->cpu_env, t0, cpu_gpr[gprn]);
    tcg_temp_free_i32(tcg_ctx, t0);
}